

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O2

int strtopcmp(char *str,char *pattern)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (pattern[lVar1] == '\0') {
      return (int)lVar1;
    }
    if (str[lVar1] != pattern[lVar1]) break;
    lVar1 = lVar1 + 1;
  }
  return -1;
}

Assistant:

static int strtopcmp(const char *str, const char *pattern)
{
   int i;

   for (i = 0;; i++) {
      if (pattern[i] == '\0')
         return i;
      if (str[i] == '\0')
         return -1;
      if (str[i] != pattern[i])
         return -1;
   }
}